

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_attribute.h
# Opt level: O3

value_type *
winmd::reader::ElemSig::read_element
          (value_type *__return_storage_ptr__,database *db,ParamSig *param,byte_view *data)

{
  __index_type _Var1;
  database *pdVar2;
  long lVar3;
  cache *this;
  uint uVar4;
  table_base *ptVar5;
  value_type *pvVar6;
  undefined1 extraout_DL;
  byte_view *data_00;
  uint32_t row;
  string_view sVar7;
  TypeDef TVar8;
  string local_88;
  string_view local_68;
  byte local_58;
  undefined7 uStack_57;
  byte_view *local_48;
  TypeDef local_40;
  
  _Var1 = *(__index_type *)
           ((long)&(param->m_type).m_type.
                   super__Variant_base<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                   .
                   super__Move_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                   .
                   super__Copy_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                   .
                   super__Move_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                   .
                   super__Copy_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
           + 0x38);
  if (_Var1 != '\x01') {
    if (_Var1 == '\0') {
      read_primitive(__return_storage_ptr__,
                     *(ElementType *)
                      &(param->m_type).m_type.
                       super__Variant_base<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                       .
                       super__Move_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                       .
                       super__Copy_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                       .
                       super__Move_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                       .
                       super__Copy_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                       .
                       super__Variant_storage_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                       ._M_u,data);
      return __return_storage_ptr__;
    }
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "Custom attribute params must be primitives, enums, or System.Type","");
    impl::throw_invalid(&local_88);
  }
  uVar4 = *(uint *)((long)&(param->m_type).m_type.
                           super__Variant_base<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                           .
                           super__Move_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                           .
                           super__Copy_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                           .
                           super__Move_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                           .
                           super__Copy_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                   + 8);
  if ((uVar4 & 3) == 1) {
    ptVar5 = (table_base *)
             **(undefined8 **)
               &(param->m_type).m_type.
                super__Variant_base<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                .
                super__Move_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                .
                super__Copy_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                .
                super__Move_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                .
                super__Copy_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                .
                super__Variant_storage_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                ._M_u;
    pdVar2 = ptVar5->m_database;
    uVar4 = table_base::get_value<unsigned_int>(ptVar5,(uVar4 >> 2) - 1,2);
    sVar7 = database::get_string(pdVar2,uVar4);
    if ((sVar7._M_len != 6) ||
       ((short)*(int *)((long)sVar7._M_str + 4) != 0x6d65 || *(int *)sVar7._M_str != 0x74737953))
    goto LAB_001513f9;
    ptVar5 = (table_base *)
             **(undefined8 **)
               &(param->m_type).m_type.
                super__Variant_base<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                .
                super__Move_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                .
                super__Copy_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                .
                super__Move_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                .
                super__Copy_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                .
                super__Variant_storage_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                ._M_u;
    pdVar2 = ptVar5->m_database;
    uVar4 = table_base::get_value<unsigned_int>
                      (ptVar5,(*(uint *)((long)&(param->m_type).m_type.
                                                super__Variant_base<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                                                .
                                                super__Move_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                                                .
                                                super__Copy_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                                                .
                                                super__Move_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                                                .
                                                super__Copy_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                                        + 8) >> 2) - 1,1);
    sVar7 = database::get_string(pdVar2,uVar4);
    if ((sVar7._M_len != 4) || (*(int *)sVar7._M_str != 0x65707954)) goto LAB_001513f9;
LAB_001515eb:
    sVar7 = read<std::basic_string_view<char,std::char_traits<char>>>(data);
    *(string_view *)
     &(__return_storage_ptr__->
      super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
      ).
      super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
      .
      super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
      .
      super__Move_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
      .
      super__Copy_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
      .
      super__Variant_storage_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
      ._M_u = sVar7;
    (__return_storage_ptr__->
    super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
    ).
    super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
    .
    super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
    .
    super__Move_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
    .
    super__Copy_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
    .
    super__Variant_storage_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
    ._M_index = '\r';
  }
  else {
LAB_001513f9:
    uVar4 = *(uint *)((long)&(param->m_type).m_type.
                             super__Variant_base<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                             .
                             super__Move_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                             .
                             super__Copy_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                             .
                             super__Move_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                             .
                             super__Copy_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                     + 8);
    if ((uVar4 & 3) == 0) {
      lVar3 = **(long **)&(param->m_type).m_type.
                          super__Variant_base<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                          .
                          super__Move_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                          .
                          super__Copy_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                          .
                          super__Move_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                          .
                          super__Copy_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                          .
                          super__Variant_storage_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                          ._M_u;
      pdVar2 = *(database **)(lVar3 + 0x78);
      uVar4 = table_base::get_value<unsigned_int>((table_base *)(lVar3 + 0x78),(uVar4 >> 2) - 1,2);
      sVar7 = database::get_string(pdVar2,uVar4);
      if ((sVar7._M_len == 6) &&
         ((short)*(int *)((long)sVar7._M_str + 4) == 0x6d65 && *(int *)sVar7._M_str == 0x74737953))
      {
        lVar3 = **(long **)&(param->m_type).m_type.
                            super__Variant_base<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                            .
                            super__Move_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                            .
                            super__Copy_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                            .
                            super__Move_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                            .
                            super__Copy_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                            .
                            super__Variant_storage_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                            ._M_u;
        pdVar2 = *(database **)(lVar3 + 0x78);
        uVar4 = table_base::get_value<unsigned_int>
                          ((table_base *)(lVar3 + 0x78),
                           (*(uint *)((long)&(param->m_type).m_type.
                                             super__Variant_base<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                                             .
                                             super__Move_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                                             .
                                             super__Copy_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                                             .
                                             super__Move_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                                             .
                                             super__Copy_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                                     + 8) >> 2) - 1,1);
        sVar7 = database::get_string(pdVar2,uVar4);
        if ((sVar7._M_len == 4) && (*(int *)sVar7._M_str == 0x65707954)) goto LAB_001515eb;
      }
    }
    uVar4 = *(uint *)((long)&(param->m_type).m_type.
                             super__Variant_base<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                             .
                             super__Move_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                             .
                             super__Copy_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                             .
                             super__Move_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                             .
                             super__Copy_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                     + 8);
    ptVar5 = (table_base *)
             **(undefined8 **)
               &(param->m_type).m_type.
                super__Variant_base<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                .
                super__Move_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                .
                super__Copy_assign_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                .
                super__Move_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                .
                super__Copy_ctor_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                .
                super__Variant_storage_alias<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                ._M_u;
    local_48 = data;
    if ((uVar4 & 3) == 0) {
      ptVar5 = ptVar5 + 3;
      local_40.super_row_base<winmd::reader::TypeDef>.m_index = (uVar4 >> 2) - 1;
    }
    else {
      row = (uVar4 >> 2) - 1;
      this = db->m_cache;
      pdVar2 = ptVar5->m_database;
      uVar4 = table_base::get_value<unsigned_int>(ptVar5,row,2);
      local_88._0_16_ = database::get_string(pdVar2,uVar4);
      pdVar2 = ptVar5->m_database;
      uVar4 = table_base::get_value<unsigned_int>(ptVar5,row,1);
      local_68 = database::get_string(pdVar2,uVar4);
      TVar8 = cache::find_required(this,(string_view *)&local_88,&local_68);
      ptVar5 = TVar8.super_row_base<winmd::reader::TypeDef>.m_table;
      local_40.super_row_base<winmd::reader::TypeDef>.m_index =
           TVar8.super_row_base<winmd::reader::TypeDef>.m_index;
    }
    local_40.super_row_base<winmd::reader::TypeDef>.m_table = ptVar5;
    uVar4 = table_base::get_value<unsigned_int>
                      (ptVar5,local_40.super_row_base<winmd::reader::TypeDef>.m_index,3);
    local_68._M_str._0_4_ = uVar4;
    local_68._M_len = (size_t)ptVar5;
    get_type_namespace_and_name
              ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                *)&local_88,(coded_index<winmd::reader::TypeDefOrRef> *)&local_68);
    if ((((local_88._M_dataplus._M_p != (pointer)0x6) ||
         ((short)*(int *)(local_88._M_string_length + 4) != 0x6d65 ||
          *(int *)local_88._M_string_length != 0x74737953)) ||
        (CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,local_88.field_2._M_local_buf[0]) !=
         4)) || (*(int *)local_88.field_2._8_8_ != 0x6d756e45)) {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,
                 "CustomAttribute params that are TypeDefOrRef must be an enum or System.Type","");
      impl::throw_invalid(&local_88);
    }
    EnumDefinition::EnumDefinition((EnumDefinition *)&local_88,&local_40);
    local_58 = local_88.field_2._M_local_buf[0];
    local_68._M_len = (size_t)local_88._M_dataplus._M_p;
    local_68._M_str = (char *)local_88._M_string_length;
    pvVar6 = read_enum((value_type *)(ulong)(byte)local_88.field_2._M_local_buf[0],
                       (ElementType)local_48,data_00);
    *(size_t *)
     &(__return_storage_ptr__->
      super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
      ).
      super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
      .
      super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
      .
      super__Move_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
      .
      super__Copy_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
      .
      super__Variant_storage_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
      ._M_u = local_68._M_len;
    *(char **)((long)&(__return_storage_ptr__->
                      super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                      ).
                      super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                      .
                      super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                      .
                      super__Move_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                      .
                      super__Copy_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                      .
                      super__Variant_storage_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                      ._M_u + 8) = local_68._M_str;
    *(ulong *)((long)&(__return_storage_ptr__->
                      super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                      ).
                      super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                      .
                      super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                      .
                      super__Move_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                      .
                      super__Copy_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                      .
                      super__Variant_storage_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                      ._M_u + 0x10) = CONCAT71(uStack_57,local_58);
    *(value_type **)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             ).
             super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             .
             super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             .
             super__Move_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             .
             super__Copy_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             .
             super__Variant_storage_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             ._M_u + 0x18) = pvVar6;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             ).
             super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             .
             super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             .
             super__Move_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             .
             super__Copy_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             .
             super__Variant_storage_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
             ._M_u + 0x20) = extraout_DL;
    (__return_storage_ptr__->
    super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
    ).
    super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
    .
    super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
    .
    super__Move_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
    .
    super__Copy_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
    .
    super__Variant_storage_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
    ._M_index = '\x0e';
  }
  return __return_storage_ptr__;
}

Assistant:

static value_type read_element(database const& db, ParamSig const& param, byte_view& data)
        {
            auto const& type = param.Type().Type();
            if (auto element_type = std::get_if<ElementType>(&type))
            {
                return read_primitive(*element_type, data);
            }
            else if (auto type_index = std::get_if<coded_index<TypeDefOrRef>>(&type))
            {
                if ((type_index->type() == TypeDefOrRef::TypeRef && type_index->TypeRef().TypeNamespace() == "System" && type_index->TypeRef().TypeName() == "Type") ||
                    (type_index->type() == TypeDefOrRef::TypeDef && type_index->TypeDef().TypeNamespace() == "System" && type_index->TypeDef().TypeName() == "Type"))
                {
                    return SystemType{ read<std::string_view>(data) };
                }
                else
                {
                    // Should be an enum. Resolve it.
                    auto resolve_type = [&db, &type_index]() -> TypeDef
                    {
                        if (type_index->type() == TypeDefOrRef::TypeDef)
                        {
                            return type_index->TypeDef();
                        }
                        auto const& typeref = type_index->TypeRef();
                        return db.get_cache().find_required(typeref.TypeNamespace(), typeref.TypeName());
                    };
                    TypeDef const& enum_type = resolve_type();
                    if (!enum_type.is_enum())
                    {
                        impl::throw_invalid("CustomAttribute params that are TypeDefOrRef must be an enum or System.Type");
                    }

                    auto const& enum_def = enum_type.get_enum_definition();
                    return EnumValue{ enum_def, read_enum(enum_def.m_underlying_type, data) };
                }
            }
            impl::throw_invalid("Custom attribute params must be primitives, enums, or System.Type");
        }